

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O2

DFsVariable * __thiscall DFsScript::FindVariable(DFsScript *this,char *name)

{
  DFsVariable *pDVar1;
  
  while ((pDVar1 = (DFsVariable *)0x0, this != (DFsScript *)0x0 &&
         (pDVar1 = VariableForName(this,name), pDVar1 == (DFsVariable *)0x0))) {
    this = GC::ReadBarrier<DFsScript>((DFsScript **)&this->parent);
  }
  return pDVar1;
}

Assistant:

DFsVariable *DFsScript::FindVariable(const char *name)
{
	DFsVariable *var;
	DFsScript *current = this;
	
	while(current)
    {
		// check this script
		if ((var = current->VariableForName(name)))
			return var;
		current = current->parent;    // try the parent of this one
    }
	
	return NULL;    // no variable
}